

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc2_color(void *pBlock,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  byte bVar1;
  color_quad_u8 *this;
  bool bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  component_t *pcVar7;
  byte bVar8;
  byte in_DL;
  color_quad_u8 *in_RSI;
  etc1_block *in_RDI;
  bool in_stack_00000017;
  uint *in_stack_00000018;
  void *in_stack_00000020;
  uint c_5;
  uint j_1;
  uint c_4;
  uint i_1;
  uint c_3;
  int16 color [3];
  int16 di [3];
  int16 dj [3];
  int16 base [3];
  uint j;
  uint i;
  uint8 c1;
  uint8 c0;
  uint c_2;
  uint8 delta_1;
  int c_1;
  int d;
  uint8 modifier;
  uint c;
  uint8 delta;
  uint8 unpacked [3];
  color_quad_u8 block_colors [4];
  bool gOverflow;
  bool rOverflow;
  uint8 *B;
  etc1_block *block;
  color_quad_u8 *pDst;
  color_quad_u8 *local_b8;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  short asStack_98 [6];
  short local_8c;
  short local_8a;
  short local_88;
  ushort local_86 [3];
  uint local_80;
  uint local_7c;
  byte local_76;
  byte local_75;
  uint local_74;
  byte local_6d;
  int local_6c;
  int local_68;
  byte local_61;
  uint local_60;
  byte local_5c;
  byte local_5b [3];
  color_quad_u8 local_58 [4];
  color_quad_u8 acStack_48 [3];
  bool local_3a;
  bool local_39;
  etc1_block *local_38;
  etc1_block *local_30;
  color_quad_u8 *local_28;
  byte local_19;
  color_quad_u8 *local_18;
  etc1_block *local_10;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar2 = unpack_etc1_block(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  if (!bVar2) {
    local_28 = local_18;
    local_30 = local_10;
    local_38 = local_10;
    local_39 = (((int)(char)((local_10->field_0).m_bytes[0] << 5) >> 5) +
                ((int)(uint)(local_10->field_0).m_bytes[0] >> 3) & 0x20U) != 0;
    local_3a = (((int)(char)((local_10->field_0).m_bytes[1] << 5) >> 5) +
                ((int)(uint)(local_10->field_0).m_bytes[1] >> 3) & 0x20U) != 0;
    if ((local_39) || (local_3a)) {
      local_b8 = (color_quad_u8 *)(local_5b + 3);
      do {
        color_quad_u8::color_quad_u8(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != acStack_48);
      if ((local_39 & 1U) == 0) {
        local_5b[0] = (byte)((int)(uint)(local_38->field_0).m_bytes[0] >> 3) & 0xf |
                      ((local_38->field_0).m_bytes[2] & 0x78) << 1;
        local_5b[1] = (byte)((int)(uint)(local_38->field_0).m_bytes[1] >> 4) & 1 |
                      ((local_38->field_0).m_bytes[0] & 7) << 1 |
                      (byte)((int)(uint)(local_38->field_0).m_bytes[3] >> 3) & 0x10 |
                      (local_38->field_0).m_bytes[2] << 5;
        local_5b[2] = (byte)((int)(uint)(local_38->field_0).m_bytes[2] >> 7) |
                      ((local_38->field_0).m_bytes[1] & 3) << 1 | (local_38->field_0).m_bytes[1] & 8
                      | ((local_38->field_0).m_bytes[3] & 0x78) << 1;
        local_61 = (local_38->field_0).m_bytes[3] & 4 | ((local_38->field_0).m_bytes[3] & 1) << 1 |
                   1;
        local_68 = 0;
        local_6c = 0;
        while (local_68 == 0 && local_6c < 3) {
          local_68 = (local_5b[local_6c] & 0xf) - ((int)(uint)local_5b[local_6c] >> 4);
          local_6c = local_6c + 1;
          bVar8 = 7;
          if (local_68 < 0) {
            bVar8 = 6;
          }
          local_61 = local_61 & bVar8;
        }
        local_6d = *(byte *)((long)&g_etc2_modifier_table + (ulong)local_61);
        for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
          local_75 = local_5b[local_74] << 4 | local_5b[local_74] & 0xf;
          local_76 = (byte)((int)(uint)local_5b[local_74] >> 4) | local_5b[local_74] & 0xf0;
          iVar4 = math::maximum<int>(0,(uint)local_76 - (uint)local_6d);
          pcVar7 = color_quad_u8::operator[]((color_quad_u8 *)(local_5b + 3),local_74);
          *pcVar7 = (component_t)iVar4;
          iVar4 = math::minimum<int>(0xff,(uint)local_76 + (uint)local_6d);
          pcVar7 = color_quad_u8::operator[](local_58 + 1,local_74);
          *pcVar7 = (component_t)iVar4;
          iVar4 = math::minimum<int>(0xff,(uint)local_75 + (uint)local_6d);
          pcVar7 = color_quad_u8::operator[](local_58 + 2,local_74);
          *pcVar7 = (component_t)iVar4;
          iVar4 = math::maximum<int>(0,(uint)local_75 - (uint)local_6d);
          pcVar7 = color_quad_u8::operator[](local_58 + 3,local_74);
          *pcVar7 = (component_t)iVar4;
        }
      }
      else {
        local_5b[0] = (local_38->field_0).m_bytes[0] & 3 |
                      (byte)((int)(uint)(local_38->field_0).m_bytes[0] >> 1) & 0xc |
                      (local_38->field_0).m_bytes[2] & 0xf0;
        local_5b[1] = (byte)((int)(uint)(local_38->field_0).m_bytes[1] >> 4) |
                      (local_38->field_0).m_bytes[2] << 4;
        local_5b[2] = (local_38->field_0).m_bytes[1] & 0xf | (local_38->field_0).m_bytes[3] & 0xf0;
        local_5c = *(byte *)((long)&g_etc2_modifier_table +
                            (long)(int)((local_38->field_0).m_bytes[3] & 1 |
                                       (int)(uint)(local_38->field_0).m_bytes[3] >> 1 & 6U));
        for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
          bVar8 = local_5b[local_60];
          bVar1 = local_5b[local_60];
          pbVar6 = color_quad_u8::operator[](local_58 + 2,local_60);
          *pbVar6 = bVar8 << 4 | bVar1 & 0xf;
          bVar8 = local_5b[local_60];
          bVar1 = local_5b[local_60];
          pbVar6 = color_quad_u8::operator[](local_58 + 1,local_60);
          *pbVar6 = (byte)((int)(uint)bVar8 >> 4) | bVar1 & 0xf0;
          pbVar6 = color_quad_u8::operator[](local_58 + 1,local_60);
          iVar4 = math::maximum<int>(0,(uint)*pbVar6 - (uint)local_5c);
          pcVar7 = color_quad_u8::operator[]((color_quad_u8 *)(local_5b + 3),local_60);
          *pcVar7 = (component_t)iVar4;
          pbVar6 = color_quad_u8::operator[](local_58 + 1,local_60);
          iVar4 = math::minimum<int>(0xff,(uint)*pbVar6 + (uint)local_5c);
          pcVar7 = color_quad_u8::operator[](local_58 + 3,local_60);
          *pcVar7 = (component_t)iVar4;
        }
      }
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        for (local_80 = 0; this = local_28, local_80 < 4; local_80 = local_80 + 1) {
          uVar5 = etc1_block::get_selector(local_30,local_80,local_7c);
          color_quad_u8::set_rgb(this,(color_quad_u8 *)(local_5b + (ulong)uVar5 * 4 + 3));
          if ((local_19 & 1) == 0) {
            (local_28->field_0).field_0.a = 0xff;
          }
          local_28 = local_28 + 1;
        }
      }
    }
    else {
      local_86[0] = ((local_10->field_0).m_bytes[0] & 0x7e) << 1 |
                    (ushort)((int)(uint)(local_10->field_0).m_bytes[0] >> 5) & 3;
      local_86[1] = ((local_10->field_0).m_bytes[0] & 1) << 7 |
                    (local_10->field_0).m_bytes[1] & 0x7e | (local_10->field_0).m_bytes[0] & 1;
      local_86[2] = ((local_10->field_0).m_bytes[1] & 1) << 7 |
                    ((local_10->field_0).m_bytes[2] & 0x18) << 2 |
                    ((local_10->field_0).m_bytes[2] & 3) << 3 |
                    (ushort)((int)(uint)(local_10->field_0).m_bytes[3] >> 5) & 4 |
                    ((local_10->field_0).m_bytes[1] & 1) << 1 |
                    (ushort)((int)(uint)(local_10->field_0).m_bytes[2] >> 4) & 1;
      asStack_98[3] =
           (((local_10->field_0).m_bytes[5] & 7) << 5 |
            (ushort)((int)(uint)(local_10->field_0).m_bytes[6] >> 3) & 0x1c |
           (ushort)((int)(uint)(local_10->field_0).m_bytes[5] >> 1) & 3) - local_86[0];
      asStack_98[4] =
           (((local_10->field_0).m_bytes[6] & 0x1f) << 3 |
            (ushort)((int)(uint)(local_10->field_0).m_bytes[7] >> 5) & 6 |
           (ushort)((int)(uint)(local_10->field_0).m_bytes[6] >> 4) & 1) - local_86[1];
      asStack_98[5] =
           (((local_10->field_0).m_bytes[7] & 0x3f) << 2 |
           (ushort)((int)(uint)(local_10->field_0).m_bytes[7] >> 4) & 3) - local_86[2];
      local_8c = (((local_10->field_0).m_bytes[3] & 0x7c) << 1 |
                  ((local_10->field_0).m_bytes[3] & 1) << 2 |
                 (ushort)((int)(uint)(local_10->field_0).m_bytes[3] >> 5) & 3) - local_86[0];
      local_8a = ((local_10->field_0).m_bytes[4] & 0xfe |
                 (ushort)((int)(uint)(local_10->field_0).m_bytes[4] >> 7)) - local_86[1];
      local_88 = (((local_10->field_0).m_bytes[4] & 1) << 7 |
                  (ushort)((int)(uint)(local_10->field_0).m_bytes[5] >> 1) & 0x7c |
                  ((local_10->field_0).m_bytes[4] & 1) << 1 |
                 (ushort)((int)(uint)(local_10->field_0).m_bytes[5] >> 7)) - local_86[2];
      for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
        asStack_98[(ulong)local_9c + 9] = asStack_98[(ulong)local_9c + 9] * 4 + 2;
      }
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
          asStack_98[local_a4] = asStack_98[(ulong)local_a4 + 9];
          asStack_98[(ulong)local_a4 + 9] =
               asStack_98[(ulong)local_a4 + 9] + asStack_98[(ulong)local_a4 + 3];
        }
        for (local_a8 = 0; local_a8 < 4; local_a8 = local_a8 + 1) {
          for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
            sVar3 = math::clamp<short>(asStack_98[local_ac],0,0x3fc);
            (local_28->field_0).c[local_ac] = (component_t)(sVar3 >> 2);
            asStack_98[local_ac] = asStack_98[local_ac] + asStack_98[(ulong)local_ac + 6];
          }
          if ((local_19 & 1) == 0) {
            (local_28->field_0).field_0.a = 0xff;
          }
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool unpack_etc2_color(const void* pBlock, unsigned int* pDst_pixels_rgba, bool preserve_alpha) {
  if (unpack_etc1_block(pBlock, pDst_pixels_rgba, preserve_alpha))
    return true;

  color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
  const etc1_block& block = *static_cast<const etc1_block*>(pBlock);
  const uint8* B = block.m_bytes;
  const bool rOverflow = ((int8(B[0] << 5) >> 5) + (B[0] >> 3)) & 0x20;
  const bool gOverflow = ((int8(B[1] << 5) >> 5) + (B[1] >> 3)) & 0x20;

  if (rOverflow || gOverflow) {
    color_quad_u8 block_colors[4];
    uint8 unpacked[3];
    if (rOverflow) {
      unpacked[0] = (B[0] & 0x3) | (B[0] >> 1 & 0xC) | (B[2] & 0xF0);
      unpacked[1] = B[1] >> 4 | B[2] << 4;
      unpacked[2] = (B[1] & 0xF) | (B[3] & 0xF0);
      uint8 delta = g_etc2_modifier_table[(B[3] & 1) | (B[3] >> 1 & 6)];
      for (uint c = 0; c < 3; c++) {
        block_colors[2][c] = unpacked[c] << 4 | (unpacked[c] & 0xF);
        block_colors[1][c] = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, block_colors[1][c] - delta);
        block_colors[3][c] = math::minimum(255, block_colors[1][c] + delta);
      }
    } else {
      unpacked[0] = (B[0] >> 3 & 0xF) | (B[2] << 1 & 0xF0);
      unpacked[1] = (B[1] >> 4 & 0x1) | (B[0] << 1 & 0xE) | (B[3] >> 3 & 0x10) | B[2] << 5;
      unpacked[2] = B[2] >> 7 | (B[1] << 1 & 0x6) | (B[1] & 0x8) | (B[3] << 1 & 0xF0);
      uint8 modifier = (B[3] & 4) | (B[3] << 1 & 2) | 1;
      for (int d = 0, c = 0; !d && c < 3; c++, modifier &= d < 0 ? 6 : 7)
        d = (unpacked[c] & 0xF) - (unpacked[c] >> 4);
      uint8 delta = g_etc2_modifier_table[modifier];
      for (uint c = 0; c < 3; c++) {
        uint8 c0 = unpacked[c] << 4 | (unpacked[c] & 0xF);
        uint8 c1 = unpacked[c] >> 4 | (unpacked[c] & 0xF0);
        block_colors[0][c] = math::maximum(0, c1 - delta);
        block_colors[1][c] = math::minimum(255, c1 + delta);
        block_colors[2][c] = math::minimum(255, c0 + delta);
        block_colors[3][c] = math::maximum(0, c0 - delta);
      }
    }
    for (uint i = 0; i < 4; i++) {
      for (uint j = 0; j < 4; j++, pDst++) {
        pDst->set_rgb(block_colors[block.get_selector(j, i)]);
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  } else {
    int16 base[3], dj[3], di[3], color[3];
    base[0] = (B[0] << 1 & 0xFC) | (B[0] >> 5 & 3);
    base[1] = (B[0] << 7 & 0x80) | (B[1] & 0x7E) | (B[0] & 1);
    base[2] = (B[1] << 7 & 0x80) | (B[2] << 2 & 0x60) | (B[2] << 3 & 0x18) | (B[3] >> 5 & 4) | (B[1] << 1 & 2) | (B[2] >> 4 & 1);
    di[0] = ((B[5] << 5 & 0xE0) | (B[6] >> 3 & 0x1C) | (B[5] >> 1 & 0x3)) - base[0];
    di[1] = ((B[6] << 3 & 0xF8) | (B[7] >> 5 & 0x6) | (B[6] >> 4 & 0x1)) - base[1];
    di[2] = ((B[7] << 2 & 0xFC) | (B[7] >> 4 & 0x3)) - base[2];
    dj[0] = ((B[3] << 1 & 0xF8) | (B[3] << 2 & 0x4) | (B[3] >> 5 & 0x3)) - base[0];
    dj[1] = ((B[4] & 0xFE) | B[4] >> 7) - base[1];
    dj[2] = ((B[4] << 7 & 0x80) | (B[5] >> 1 & 0x7C) | (B[4] << 1 & 0x2) | B[5] >> 7) - base[2];
    for (uint c = 0; c < 3; c++)
      base[c] = (base[c] << 2) + 2;
    for (uint i = 0; i < 4; i++) {
      for (uint c = 0; c < 3; base[c] += di[c], c++)
        color[c] = base[c];
      for (uint j = 0; j < 4; j++, pDst++) {
        for (uint c = 0; c < 3; color[c] += dj[c], c++)
          pDst->c[c] = math::clamp<int16>(color[c], 0, 1020) >> 2;
        if (!preserve_alpha)
          pDst->a = 255;
      }
    }
  }
  return true;
}